

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O1

Ref<embree::SceneGraph::Node> __thiscall
embree::XMLLoader::loadPointLight(XMLLoader *this,Ref<embree::XML> *xml)

{
  undefined1 auVar1 [16];
  pointer pcVar2;
  undefined8 *in_RDX;
  XMLLoader *this_00;
  string *childID;
  Vec3f VVar3;
  AffineSpace3fa space;
  undefined1 local_b0 [24];
  undefined1 local_98 [16];
  _Alloc_hider local_88;
  _Alloc_hider local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  undefined1 local_68 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_58;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  float local_38;
  float fStack_34;
  float fStack_30;
  float fStack_2c;
  float local_28;
  float fStack_24;
  float fStack_20;
  float fStack_1c;
  
  this_00 = (XMLLoader *)*in_RDX;
  local_78._M_allocated_capacity._0_2_ = 0x6641;
  local_78._M_allocated_capacity._2_5_ = 0x53656e6966;
  local_78._7_4_ = 0x65636170;
  local_80._M_p = (pointer)0xb;
  local_78._M_local_buf[0xb] = '\0';
  local_88._M_p = (pointer)&local_78;
  XML::child((XML *)local_b0,(string *)this_00);
  load<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3fa>>>
            ((AffineSpace3fa *)&local_58.field_1,this_00,(Ref<embree::XML> *)local_b0);
  if ((long *)CONCAT44(local_b0._4_4_,local_b0._0_4_) != (long *)0x0) {
    (**(code **)(*(long *)CONCAT44(local_b0._4_4_,local_b0._0_4_) + 0x18))();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_p != &local_78) {
    operator_delete(local_88._M_p);
  }
  childID = (string *)*in_RDX;
  local_78._M_allocated_capacity._0_2_ = 0x49;
  local_80._M_p = (pointer)0x1;
  local_88._M_p = (pointer)&local_78;
  XML::child((XML *)(local_b0 + 0x10),childID);
  VVar3 = load<embree::Vec3<float>>((XMLLoader *)local_b0,(Ref<embree::XML> *)childID);
  local_98._4_4_ = local_b0._8_4_;
  local_98._0_4_ = local_b0._4_4_;
  local_98._8_8_ = 0;
  local_68 = ZEXT416((uint)local_b0._0_4_);
  if ((element_type *)local_b0._16_8_ != (element_type *)0x0) {
    (**(code **)(*(long *)local_b0._16_8_ + 0x18))(local_b0._0_4_,VVar3.field_0._8_4_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_p != &local_78) {
    operator_delete(local_88._M_p);
  }
  auVar1._4_4_ = local_98._0_4_;
  auVar1._0_4_ = local_68._0_4_;
  auVar1._8_4_ = local_98._4_4_;
  auVar1._12_4_ = 0;
  local_98 = auVar1;
  pcVar2 = (pointer)alignedMalloc(0xa0,0x10);
  pcVar2[8] = '\0';
  pcVar2[9] = '\0';
  pcVar2[10] = '\0';
  pcVar2[0xb] = '\0';
  pcVar2[0xc] = '\0';
  pcVar2[0xd] = '\0';
  pcVar2[0xe] = '\0';
  pcVar2[0xf] = '\0';
  *(pointer *)(pcVar2 + 0x10) = pcVar2 + 0x20;
  pcVar2[0x18] = '\0';
  pcVar2[0x19] = '\0';
  pcVar2[0x1a] = '\0';
  pcVar2[0x1b] = '\0';
  pcVar2[0x1c] = '\0';
  pcVar2[0x1d] = '\0';
  pcVar2[0x1e] = '\0';
  pcVar2[0x1f] = '\0';
  pcVar2[0x20] = '\0';
  *(pointer *)(pcVar2 + 0x30) = pcVar2 + 0x40;
  pcVar2[0x38] = '\0';
  pcVar2[0x39] = '\0';
  pcVar2[0x3a] = '\0';
  pcVar2[0x3b] = '\0';
  pcVar2[0x3c] = '\0';
  pcVar2[0x3d] = '\0';
  pcVar2[0x3e] = '\0';
  pcVar2[0x3f] = '\0';
  pcVar2[0x40] = '\0';
  pcVar2[0x50] = '\0';
  pcVar2[0x51] = '\0';
  pcVar2[0x52] = '\0';
  pcVar2[0x53] = '\0';
  pcVar2[0x54] = '\0';
  pcVar2[0x55] = '\0';
  pcVar2[0x56] = '\0';
  pcVar2[0x57] = '\0';
  pcVar2[0x58] = '\0';
  pcVar2[0x59] = '\0';
  pcVar2[0x5c] = -1;
  pcVar2[0x5d] = -1;
  pcVar2[0x5e] = -1;
  pcVar2[0x5f] = -1;
  pcVar2[0x60] = '\0';
  pcVar2[0x61] = '\0';
  pcVar2[0x62] = '\0';
  pcVar2[99] = '\0';
  pcVar2[100] = '\0';
  pcVar2[0x65] = '\0';
  pcVar2[0x66] = '\0';
  pcVar2[0x67] = '\0';
  *(undefined ***)pcVar2 = &PTR__Node_002cc860;
  pcVar2[0x70] = '\x01';
  pcVar2[0x71] = '\0';
  pcVar2[0x72] = '\0';
  pcVar2[0x73] = '\0';
  *(float *)(pcVar2 + 0x80) = local_58.m128[0] * 0.0 + local_48 * 0.0 + local_38 * 0.0 + local_28;
  *(float *)(pcVar2 + 0x84) = local_58.m128[1] * 0.0 + fStack_44 * 0.0 + fStack_34 * 0.0 + fStack_24
  ;
  *(float *)(pcVar2 + 0x88) = local_58.m128[2] * 0.0 + fStack_40 * 0.0 + fStack_30 * 0.0 + fStack_20
  ;
  *(float *)(pcVar2 + 0x8c) = local_58.m128[3] * 0.0 + fStack_3c * 0.0 + fStack_2c * 0.0 + fStack_1c
  ;
  *(undefined8 *)(pcVar2 + 0x90) = local_98._0_8_;
  *(undefined8 *)(pcVar2 + 0x98) = local_98._8_8_;
  (this->path).filename._M_dataplus._M_p = pcVar2;
  LOCK();
  *(long *)(pcVar2 + 8) = *(long *)(pcVar2 + 8) + 1;
  UNLOCK();
  return (Ref<embree::SceneGraph::Node>)(Node *)this;
}

Assistant:

Ref<SceneGraph::Node> XMLLoader::loadPointLight(const Ref<XML>& xml) 
  {
    const AffineSpace3fa space = load<AffineSpace3fa>(xml->child("AffineSpace"));
    const Vec3fa I = load<Vec3f>(xml->child("I"));
    const Vec3fa P = Vec3fa(zero);
    const SceneGraph::PointLight light = SceneGraph::PointLight(P,I);
    return new SceneGraph::LightNodeImpl<SceneGraph::PointLight>(light.transform(space));
  }